

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.cpp
# Opt level: O0

void * crnlib::crnlib_realloc(void *p,size_t size,size_t *pActual_size,bool movable)

{
  void *p_new;
  size_t actual_size;
  size_t *psStack_28;
  bool movable_local;
  size_t *pActual_size_local;
  size_t size_local;
  void *p_local;
  
  actual_size._7_1_ = movable;
  psStack_28 = pActual_size;
  pActual_size_local = (size_t *)size;
  size_local = (size_t)p;
  if (((ulong)p & 0xf) == 0) {
    if (size < 0x400000001) {
      if ((size != 0) && (size < 4)) {
        pActual_size_local = (size_t *)0x4;
      }
      p_new = pActual_size_local;
      p_local = (void *)(*(code *)g_pRealloc)(p,pActual_size_local,&p_new,movable,g_pUser_data);
      if (psStack_28 != (size_t *)0x0) {
        *psStack_28 = (size_t)p_new;
      }
    }
    else {
      crnlib_mem_error("crnlib_malloc: size too big");
      p_local = (void *)0x0;
    }
  }
  else {
    crnlib_mem_error("crnlib_realloc: bad ptr");
    p_local = (void *)0x0;
  }
  return p_local;
}

Assistant:

void* crnlib_realloc(void* p, size_t size, size_t* pActual_size, bool movable)
    {
        if ((ptr_bits_t)p & (CRNLIB_MIN_ALLOC_ALIGNMENT - 1))
        {
            crnlib_mem_error("crnlib_realloc: bad ptr");
            return nullptr;
        }

        if (size > CRNLIB_MAX_POSSIBLE_BLOCK_SIZE)
        {
            crnlib_mem_error("crnlib_malloc: size too big");
            return nullptr;
        }

#if CRNLIB_MEM_STATS
        size_t cur_size = p ? (*g_pMSize)(p, g_pUser_data) : 0;
        CRNLIB_ASSERT(!p || (cur_size >= sizeof(uint32)));
#endif
        if ((size) && (size < sizeof(uint32)))
        {
            size = sizeof(uint32);
        }

        size_t actual_size = size;
        void* p_new = (*g_pRealloc)(p, size, &actual_size, movable, g_pUser_data);

        if (pActual_size)
        {
            *pActual_size = actual_size;
        }

        CRNLIB_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (CRNLIB_MIN_ALLOC_ALIGNMENT - 1)) == 0);

#if CRNLIB_MEM_STATS
        CRNLIB_ASSERT(!p_new || ((*g_pMSize)(p_new, g_pUser_data) == actual_size));

        int num_new_blocks = 0;
        if (p)
        {
            if (!p_new)
                num_new_blocks = -1;
        }
        else if (p_new)
        {
            num_new_blocks = 1;
        }
        update_total_allocated(num_new_blocks, static_cast<mem_stat_t>(actual_size) - static_cast<mem_stat_t>(cur_size));
#endif

        return p_new;
    }